

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAttributes.cpp
# Opt level: O3

void print_type<int>(TypedAttribute<int> *object)

{
  char *__s;
  size_t sVar1;
  
  __s = (char *)(**(code **)(*(long *)object + 0x10))();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1eefa0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  return;
}

Assistant:

void
print_type (const OPENEXR_IMF_NAMESPACE::TypedAttribute<T>& object)
{
    cout << object.typeName () << endl;
}